

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

void __thiscall
snmalloc::MessageBuilder<1024UL>::append(MessageBuilder<1024UL> *this,unsigned_long_long s)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  char cStack_19;
  Array<char,_16> buf;
  
  uVar2 = this->insert;
  if (uVar2 < 0x3ff) {
    this->insert = uVar2 + 1;
    (this->buffer)._M_elems[uVar2] = '0';
    uVar2 = this->insert;
    if (uVar2 < 0x3ff) {
      this->insert = uVar2 + 1;
      (this->buffer)._M_elems[uVar2] = 'x';
    }
  }
  buf._M_elems[0] = '\0';
  buf._M_elems[1] = '\0';
  buf._M_elems[2] = '\0';
  buf._M_elems[3] = '\0';
  buf._M_elems[4] = '\0';
  buf._M_elems[5] = '\0';
  buf._M_elems[6] = '\0';
  buf._M_elems[7] = '\0';
  buf._M_elems[8] = '\0';
  buf._M_elems[9] = '\0';
  buf._M_elems[10] = '\0';
  buf._M_elems[0xb] = '\0';
  buf._M_elems[0xc] = '\0';
  buf._M_elems[0xd] = '\0';
  buf._M_elems[0xe] = '\0';
  buf._M_elems[0xf] = '\0';
  for (lVar4 = 0x10; 0 < lVar4; lVar4 = lVar4 + -1) {
    buf._M_elems[lVar4 + -1] = "0123456789abcdef"[(uint)s & 0xf];
    s = s >> 4;
  }
  bVar3 = true;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    cVar1 = buf._M_elems[lVar4];
    if (!(bool)(bVar3 & cVar1 == '0')) {
      uVar2 = this->insert;
      if (uVar2 < 0x3ff) {
        this->insert = uVar2 + 1;
        (this->buffer)._M_elems[uVar2] = cVar1;
      }
      bVar3 = false;
    }
  }
  if ((bVar3) && (uVar2 = this->insert, uVar2 < 0x3ff)) {
    this->insert = uVar2 + 1;
    (this->buffer)._M_elems[uVar2] = '0';
  }
  return;
}

Assistant:

void append_char(char c)
    {
      if (insert < SafeLength)
      {
        buffer[insert++] = c;
      }
    }